

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kDefectiveBase.cpp
# Opt level: O1

void __thiscall KDefectiveBase::~KDefectiveBase(KDefectiveBase *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  void *pvVar3;
  long lVar4;
  
  this->_vptr_KDefectiveBase = (_func_int **)&PTR___cxa_pure_virtual_00128a50;
  pvVar1 = this->from;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar2 = pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar2 != (pointer)0x0) {
      lVar4 = (long)piVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->dis != (int *)0x0) {
    operator_delete__(this->dis);
  }
  if (this->maxDis != (int *)0x0) {
    operator_delete__(this->maxDis);
  }
  if (this->isInPC != (bool *)0x0) {
    operator_delete__(this->isInPC);
  }
  if (this->neiSet != (void **)0x0) {
    operator_delete__(this->neiSet);
  }
  if (this->neiSet2 != (void **)0x0) {
    operator_delete__(this->neiSet2);
  }
  std::deque<KDefectiveBase::State,_std::allocator<KDefectiveBase::State>_>::~deque
            (&(this->state).c);
  return;
}

Assistant:

KDefectiveBase::~KDefectiveBase() {
	delete[] from;
	delete[] dis;
    delete[] maxDis;
    delete[] isInPC;
	delete[] neiSet;
	delete[] neiSet2;
}